

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb.c
# Opt level: O0

int find_address_in_search_tree
              (MMDB_s *mmdb,uint8_t *address,sa_family_t address_family,MMDB_lookup_result_s *result
              )

{
  uint uVar1;
  uint8_t *puVar2;
  uint uVar3;
  uint32_t uVar4;
  uint8_t *puVar5;
  uint8_t bit;
  uint8_t *record_pointer;
  uint8_t *search_tree;
  uint32_t node_count;
  uint16_t current_bit;
  uint64_t value;
  record_info_s record_info;
  MMDB_lookup_result_s *result_local;
  sa_family_t address_family_local;
  uint8_t *address_local;
  MMDB_s *mmdb_local;
  
  record_info._24_8_ = result;
  record_info_for_database((record_info_s *)&value,mmdb);
  if ((byte)record_info.right_record_getter == 0) {
    mmdb_local._4_4_ = 6;
  }
  else {
    _node_count = 0;
    search_tree._6_2_ = 0;
    if (((mmdb->metadata).ip_version == 6) && (address_family == 2)) {
      _node_count = (ulong)(mmdb->ipv4_start_node).node_value;
      search_tree._6_2_ = (mmdb->ipv4_start_node).netmask;
    }
    uVar1 = (mmdb->metadata).node_count;
    puVar2 = mmdb->file_content;
    for (; search_tree._6_2_ < mmdb->depth && _node_count < uVar1;
        search_tree._6_2_ = search_tree._6_2_ + 1) {
      puVar5 = puVar2 + _node_count * (ushort)value;
      if (mmdb->data_section < puVar5 + (int)(uint)(ushort)value) {
        return 2;
      }
      if (((int)(uint)address[(int)(uint)search_tree._6_2_ >> 3] >>
           (7U - (char)((ulong)search_tree._6_2_ % 8) & 0x1f) & 1U) == 0) {
        uVar3 = (*(code *)record_info._0_8_)(puVar5);
      }
      else {
        uVar3 = (*record_info.left_record_getter)
                          (puVar5 + (int)(uint)(byte)record_info.right_record_getter);
      }
      _node_count = (ulong)uVar3;
    }
    *(uint16_t *)(record_info._24_8_ + 0x18) = search_tree._6_2_;
    if (_node_count < uVar1 + mmdb->data_section_size) {
      if (_node_count == uVar1) {
        *(undefined1 *)record_info._24_8_ = 0;
        mmdb_local._4_4_ = 0;
      }
      else {
        *(undefined1 *)record_info._24_8_ = 1;
        uVar4 = data_section_offset_for_record(mmdb,_node_count);
        *(uint32_t *)(record_info._24_8_ + 0x10) = uVar4;
        mmdb_local._4_4_ = 0;
      }
    }
    else {
      mmdb_local._4_4_ = 2;
    }
  }
  return mmdb_local._4_4_;
}

Assistant:

static int find_address_in_search_tree(const MMDB_s *const mmdb,
                                       uint8_t const *address,
                                       sa_family_t address_family,
                                       MMDB_lookup_result_s *result) {
    record_info_s record_info = record_info_for_database(mmdb);
    if (record_info.right_record_offset == 0) {
        return MMDB_UNKNOWN_DATABASE_FORMAT_ERROR;
    }

    uint64_t value = 0;
    uint16_t current_bit = 0;
    if (mmdb->metadata.ip_version == 6 && address_family == AF_INET) {
        value = mmdb->ipv4_start_node.node_value;
        current_bit = mmdb->ipv4_start_node.netmask;
    }

    uint32_t node_count = mmdb->metadata.node_count;
    const uint8_t *search_tree = mmdb->file_content;
    const uint8_t *record_pointer;
    for (; current_bit < mmdb->depth && value < node_count; current_bit++) {
        uint8_t bit =
            1U & (address[current_bit >> 3] >> (7 - (current_bit % 8)));

        // Note that value*record_info.record_length can be larger than 2**32
        record_pointer = &search_tree[value * record_info.record_length];
        if (record_pointer + record_info.record_length > mmdb->data_section) {
            return MMDB_CORRUPT_SEARCH_TREE_ERROR;
        }
        if (bit) {
            record_pointer += record_info.right_record_offset;
            value = record_info.right_record_getter(record_pointer);
        } else {
            value = record_info.left_record_getter(record_pointer);
        }
    }

    result->netmask = current_bit;

    if (value >= node_count + mmdb->data_section_size) {
        // The pointer points off the end of the database.
        return MMDB_CORRUPT_SEARCH_TREE_ERROR;
    }

    if (value == node_count) {
        // record is empty
        result->found_entry = false;
        return MMDB_SUCCESS;
    }
    result->found_entry = true;
    result->entry.offset = data_section_offset_for_record(mmdb, value);

    return MMDB_SUCCESS;
}